

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool google::ParseUnqualifiedName(State *state)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined4 uVar7;
  undefined2 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  short sVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  long lVar16;
  bool bVar17;
  char *pcVar18;
  State copy;
  
  bVar13 = ParseOperatorName(state);
  bVar17 = true;
  if (bVar13) {
    return true;
  }
  pcVar2 = state->mangled_cur;
  pcVar3 = state->out_cur;
  pcVar4 = state->out_begin;
  pcVar5 = state->out_end;
  pcVar6 = state->prev_name;
  uVar7 = state->prev_name_length;
  uVar8 = state->nest_level;
  uVar9 = state->append;
  uVar10 = state->overflowed;
  pcVar18 = state->mangled_cur;
  if (*pcVar18 == 'C') {
    state->mangled_cur = pcVar18 + 1;
    bVar13 = true;
    if (pcVar18[1] != '1') {
      lVar16 = 0;
      do {
        cVar1 = "123"[lVar16 + 1];
        if (lVar16 == 2) {
          bVar13 = cVar1 != '\0';
          goto LAB_001278ac;
        }
        lVar16 = lVar16 + 1;
      } while (pcVar18[1] != cVar1);
      bVar13 = cVar1 != '\0';
    }
    state->mangled_cur = pcVar18 + 2;
LAB_001278ac:
    if (bVar13) {
      pcVar18 = state->prev_name;
      iVar15 = state->prev_name_length;
      goto LAB_00127949;
    }
  }
  state->mangled_cur = pcVar2;
  state->out_cur = pcVar3;
  state->prev_name = pcVar6;
  state->prev_name_length = uVar7;
  state->nest_level = uVar8;
  state->append = (bool)uVar9;
  state->overflowed = (bool)uVar10;
  state->out_begin = pcVar4;
  state->out_end = pcVar5;
  pcVar18 = state->mangled_cur;
  if (*pcVar18 == 'D') {
    state->mangled_cur = pcVar18 + 1;
    bVar13 = true;
    if (pcVar18[1] != '0') {
      lVar16 = 0;
      do {
        cVar1 = "012"[lVar16 + 1];
        if (lVar16 == 2) {
          bVar13 = cVar1 != '\0';
          goto LAB_00127926;
        }
        lVar16 = lVar16 + 1;
      } while (pcVar18[1] != cVar1);
      bVar13 = cVar1 != '\0';
    }
    state->mangled_cur = pcVar18 + 2;
LAB_00127926:
    if (bVar13) {
      pcVar18 = state->prev_name;
      iVar15 = state->prev_name_length;
      MaybeAppend(state,"~");
LAB_00127949:
      MaybeAppendWithLength(state,pcVar18,iVar15);
      return true;
    }
  }
  state->prev_name = pcVar6;
  state->prev_name_length = uVar7;
  state->nest_level = uVar8;
  state->append = (bool)uVar9;
  state->overflowed = (bool)uVar10;
  state->out_begin = pcVar4;
  state->out_end = pcVar5;
  state->mangled_cur = pcVar2;
  state->out_cur = pcVar3;
  bVar13 = ParseSourceName(state);
  if (bVar13) {
LAB_0012797b:
    ParseAbiTags(state);
  }
  else {
    pcVar18 = state->mangled_cur;
    pcVar2 = state->out_cur;
    pcVar3 = state->out_begin;
    pcVar4 = state->out_end;
    pcVar5 = state->prev_name;
    iVar15 = state->prev_name_length;
    sVar11 = state->nest_level;
    bVar13 = state->append;
    bVar12 = state->overflowed;
    if (*state->mangled_cur == 'L') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar14 = ParseSourceName(state);
      if (bVar14) {
        ParseDiscriminator(state);
        goto LAB_0012797b;
      }
    }
    state->prev_name = pcVar5;
    state->prev_name_length = iVar15;
    state->nest_level = sVar11;
    state->append = bVar13;
    state->overflowed = bVar12;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    state->mangled_cur = pcVar18;
    state->out_cur = pcVar2;
    bVar17 = false;
  }
  return bVar17;
}

Assistant:

static bool ParseUnqualifiedName(State *state) {
  return (ParseOperatorName(state) ||
          ParseCtorDtorName(state) ||
          (ParseSourceName(state) && Optional(ParseAbiTags(state))) ||
          (ParseLocalSourceName(state) && Optional(ParseAbiTags(state))));
}